

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bm_utils.c
# Opt level: O3

char ** mk_ascdate(void)

{
  char **ppcVar1;
  char *__dest;
  long in_RCX;
  long extraout_RDX;
  char *in_RSI;
  int iVar2;
  long lVar3;
  long *in_R8;
  long lVar4;
  dss_time_t t;
  dss_time_t local_60;
  
  lVar3 = 0x4fe8;
  ppcVar1 = (char **)malloc(0x4fe8);
  if (ppcVar1 != (char **)0x0) {
    lVar4 = 1;
    while( true ) {
      lVar3 = 0xd;
      __dest = (char *)malloc(0xd);
      ppcVar1[lVar4 + -1] = __dest;
      if (__dest == (char *)0x0) break;
      mk_time(lVar4,&local_60);
      in_RSI = local_60.alpha;
      strcpy(__dest,local_60.alpha);
      lVar4 = lVar4 + 1;
      if (lVar4 == 0x9fe) {
        return ppcVar1;
      }
    }
    mk_ascdate_cold_1();
  }
  mk_ascdate_cold_2();
  if (in_RCX == 0 || in_RSI == (char *)0x0) {
    ppcVar1 = (char **)0x0;
  }
  else {
    if (1000 < (long)in_RSI / extraout_RDX) {
      set_state_cold_1();
      return (char **)((lVar3 % 1000) * 100 + (lVar3 / 10) % 0x4e21 + 90000);
    }
    iVar2 = (int)lVar3;
    lVar3 = (long)in_RSI * ((&tdefs)[iVar2].base % extraout_RDX);
    ppcVar1 = (char **)(lVar3 / extraout_RDX + ((&tdefs)[iVar2].base / extraout_RDX) * (long)in_RSI)
    ;
    if (1 < in_RCX) {
      lVar4 = in_RCX + -1;
      do {
        if ((&tdefs)[iVar2].gen_seed != (_func_long_varargs *)0x0) {
          (*(&tdefs)[iVar2].gen_seed)((ulong)(iVar2 == 5),ppcVar1);
          if ((long)(&tdefs)[iVar2].child != -1) {
            (*(&tdefs)[(&tdefs)[iVar2].child].gen_seed)(0,ppcVar1);
          }
        }
        lVar4 = lVar4 + -1;
      } while (lVar4 != 0);
    }
    *in_R8 = lVar3 % extraout_RDX;
    if ((extraout_RDX < in_RCX) && ((&tdefs)[iVar2].gen_seed != (_func_long_varargs *)0x0)) {
      (*(&tdefs)[iVar2].gen_seed)();
    }
  }
  return ppcVar1;
}

Assistant:

char **
mk_ascdate(void)
{
    char **m;
    dss_time_t t;
    int i;

    m = (char**) malloc((size_t)(TOTDATE * sizeof (char *)));
    MALLOC_CHECK(m);
    for (i = 0; i < TOTDATE; i++)
        {
        m[i] = (char *)malloc(DATE_LEN * sizeof(char));
        MALLOC_CHECK(m[i]);
        mk_time((long)(i + 1), &t);
        strcpy(m[i], t.alpha);
        }

    return(m);
}